

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::createPoolNullParamsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  allocator<char> local_71;
  string local_70;
  Move<vk::Handle<(vk::HandleType)24>_> local_50;
  deUint32 local_2c;
  DeviceInterface *pDStack_28;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  vkDevice = (VkDevice)context;
  context_local = (Context *)__return_storage_ptr__;
  vk = (DeviceInterface *)Context::getDevice(context);
  pDStack_28 = Context::getDeviceInterface((Context *)vkDevice);
  local_2c = Context::getUniversalQueueFamilyIndex((Context *)vkDevice);
  ::vk::createCommandPool(&local_50,pDStack_28,(VkDevice)vk,0,local_2c,(VkAllocationCallbacks *)0x0)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Command Pool allocated correctly.",&local_71);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolNullParamsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	createCommandPool(vk, vkDevice, 0u, queueFamilyIndex);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}